

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

unsigned_short * __thiscall
r_code::vector<unsigned_short>::operator[](vector<unsigned_short> *this,size_t i)

{
  size_t sVar1;
  reference pvVar2;
  size_t i_local;
  vector<unsigned_short> *this_local;
  
  sVar1 = size(this);
  if (sVar1 <= i) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&this->m_vector,i + 1);
  }
  pvVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at(&this->m_vector,i);
  return pvVar2;
}

Assistant:

T &operator [](size_t i)
    {
        if (i >= size()) {
            m_vector.resize(i + 1);
        }

        return m_vector.at(i);
    }